

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall Catch::Matchers::WithinUlpsMatcher::describe_abi_cxx11_(WithinUlpsMatcher *this)

{
  ostream *poVar1;
  long in_RSI;
  string *in_RDI;
  stringstream ret;
  undefined4 in_stack_fffffffffffffdd8;
  float in_stack_fffffffffffffddc;
  ostream *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  ostream *in_stack_fffffffffffffdf0;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"is within ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RSI + 0x30));
  std::operator<<(poVar1," ULPs of ");
  if (*(char *)(in_RSI + 0x38) == '\0') {
    anon_unknown_26::write<float>(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
    std::operator<<(local_188,'f');
  }
  else {
    anon_unknown_26::write<double>
              (in_stack_fffffffffffffdf0,
               (double)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  }
  std::operator<<(local_188," ([");
  if (*(char *)(in_RSI + 0x38) == '\x01') {
    std::numeric_limits<double>::infinity();
    anon_unknown_26::step<double>
              ((double)in_stack_fffffffffffffdf0,
               (double)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
               (uint64_t)in_stack_fffffffffffffde0);
    anon_unknown_26::write<double>
              (in_stack_fffffffffffffdf0,
               (double)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    std::operator<<(local_188,", ");
    std::numeric_limits<double>::infinity();
    anon_unknown_26::step<double>
              ((double)in_stack_fffffffffffffdf0,
               (double)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
               (uint64_t)in_stack_fffffffffffffde0);
    anon_unknown_26::write<double>
              (in_stack_fffffffffffffdf0,
               (double)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  }
  else {
    std::numeric_limits<float>::infinity();
    anon_unknown_26::step<float>
              ((float)((ulong)in_stack_fffffffffffffde0 >> 0x20),SUB84(in_stack_fffffffffffffde0,0),
               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    anon_unknown_26::write<float>(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
    std::operator<<(local_188,", ");
    poVar1 = local_188;
    std::numeric_limits<float>::infinity();
    anon_unknown_26::step<float>
              ((float)((ulong)poVar1 >> 0x20),SUB84(poVar1,0),
               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    anon_unknown_26::write<float>(poVar1,in_stack_fffffffffffffddc);
  }
  std::operator<<(local_188,"])");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string WithinUlpsMatcher::describe() const {
        std::stringstream ret;

        ret << "is within " << m_ulps << " ULPs of ";

        if (m_type == Detail::FloatingPointKind::Float) {
            write(ret, static_cast<float>(m_target));
            ret << 'f';
        } else {
            write(ret, m_target);
        }

        ret << " ([";
        if (m_type == Detail::FloatingPointKind::Double) {
            write( ret,
                   step( m_target,
                         -std::numeric_limits<double>::infinity(),
                         m_ulps ) );
            ret << ", ";
            write( ret,
                   step( m_target,
                         std::numeric_limits<double>::infinity(),
                         m_ulps ) );
        } else {
            // We have to cast INFINITY to float because of MinGW, see #1782
            write( ret,
                   step( static_cast<float>( m_target ),
                         -std::numeric_limits<float>::infinity(),
                         m_ulps ) );
            ret << ", ";
            write( ret,
                   step( static_cast<float>( m_target ),
                         std::numeric_limits<float>::infinity(),
                         m_ulps ) );
        }
        ret << "])";

        return ret.str();
    }